

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O1

XMLNodeAdapter * BSDFData::operator<<(XMLNodeAdapter *node,DataDefinition *dataDefinition)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  string local_68;
  Child<const_BSDFData::AngleBasis> local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x18),"IncidentDataStructure","");
  FileParse::Child<const_std::optional<BSDFData::IncidentDataStructure>_>::Child
            ((Child<const_std::optional<BSDFData::IncidentDataStructure>_> *)local_90,
             (string *)(local_80 + 0x18),&dataDefinition->incidentDataStructure,0);
  uVar2 = local_80._8_8_;
  if (*(bool *)(local_80._8_8_ + 4) == true) {
    if (*(bool *)(local_80._8_8_ + 4) == false) {
      std::__throw_bad_optional_access();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48.nodeNames,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90);
    local_48.data = (AngleBasis *)uVar2;
    local_48.index = 0;
    FileParse::operator<<(node,(Child<const_BSDFData::IncidentDataStructure> *)&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48.nodeNames);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_90._0_8_ = (pointer)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"AngleBasis","");
  FileParse::Child<const_BSDFData::AngleBasis>::Child
            (&local_48,(string *)local_90,&dataDefinition->angleBasis,0);
  FileParse::operator<<(node,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48.nodeNames);
  if ((pointer)local_90._0_8_ != (pointer)local_80) {
    operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 0x18),"Comments","");
  FileParse::
  Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child((Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_90,(string *)(local_80 + 0x18),&dataDefinition->comments,0);
  if (*(bool *)(local_80._8_8_ + 0x20) == true) {
    if (*(bool *)(local_80._8_8_ + 0x20) == false) {
      std::__throw_bad_optional_access();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48.nodeNames,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90);
    local_48.data = (AngleBasis *)local_80._8_8_;
    local_48.index = 0;
    FileParse::operator<<
              (node,(Child<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48.nodeNames);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return node;
}

Assistant:

NodeAdapter & operator<<(NodeAdapter & node, const BSDFData::DataDefinition & dataDefinition)
    {
        node << FileParse::Child{"IncidentDataStructure", dataDefinition.incidentDataStructure};
        node << FileParse::Child{"AngleBasis", dataDefinition.angleBasis};
        node << FileParse::Child{"Comments", dataDefinition.comments};

        return node;
    }